

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memjrnlWrite(sqlite3_file *pJfd,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_io_methods *psVar6;
  sqlite3_io_methods *psVar7;
  sqlite3_io_methods *psVar8;
  bool bVar9;
  sqlite3_io_methods *psVar10;
  sqlite3_io_methods *psVar11;
  int iVar12;
  long lVar13;
  sqlite3_io_methods *psVar14;
  sqlite3_file sVar15;
  int iVar16;
  sqlite3_io_methods *psVar17;
  int iVar18;
  sqlite3_io_methods *psVar19;
  size_t __n;
  
  lVar13 = (long)*(int *)((long)&pJfd[1].pMethods + 4);
  if ((lVar13 < 1) || (iAmt + iOfst <= lVar13)) {
    if (0 < iAmt) {
      psVar14 = pJfd[4].pMethods;
      iVar12 = iAmt;
      do {
        psVar17 = pJfd[5].pMethods;
        iVar16 = *(int *)&pJfd[1].pMethods;
        lVar13 = (long)psVar14 % (long)iVar16;
        iVar18 = iVar16 - (int)lVar13;
        if (iVar12 < iVar18) {
          iVar18 = iVar12;
        }
        sVar15.pMethods = psVar17;
        if (lVar13 == 0) {
          sVar15.pMethods = (sqlite3_io_methods *)sqlite3_malloc(iVar16 + 8);
          if (sVar15.pMethods == (sqlite3_io_methods *)0x0) {
            return 0xc0a;
          }
          if (psVar17 == (sqlite3_io_methods *)0x0) {
            psVar17 = (sqlite3_io_methods *)(pJfd + 3);
          }
          *(undefined8 *)sVar15.pMethods = 0;
          *(sqlite3_io_methods **)psVar17 = sVar15.pMethods;
          pJfd[5].pMethods = sVar15.pMethods;
        }
        __n = (size_t)iVar18;
        memcpy((void *)((long)&(sVar15.pMethods)->xClose + lVar13),zBuf,__n);
        zBuf = (void *)((long)zBuf + __n);
        psVar14 = (sqlite3_io_methods *)((long)&(pJfd[4].pMethods)->iVersion + __n);
        pJfd[4].pMethods = psVar14;
        iVar16 = iVar12 - iVar18;
        bVar9 = iVar18 <= iVar12;
        iVar12 = iVar16;
      } while (iVar16 != 0 && bVar9);
    }
    *(int *)&pJfd[2].pMethods = (int)iOfst + iAmt;
    iVar12 = 0;
  }
  else {
    puVar1 = (undefined8 *)((long)&pJfd[1].pMethods + 4);
    psVar14 = pJfd->pMethods;
    iVar16 = *(int *)&pJfd[1].pMethods;
    uVar2 = *(undefined4 *)((long)&pJfd[2].pMethods + 4);
    uVar3 = *puVar1;
    psVar17 = pJfd[3].pMethods;
    psVar4 = pJfd[4].pMethods;
    psVar5 = pJfd[7].pMethods;
    psVar10 = pJfd[5].pMethods;
    psVar11 = pJfd[6].pMethods;
    psVar6 = pJfd[8].pMethods;
    psVar7 = pJfd[9].pMethods;
    psVar8 = pJfd[10].pMethods;
    pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
    pJfd->pMethods = (sqlite3_io_methods *)0x0;
    pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[10].pMethods = (sqlite3_io_methods *)0x0;
    iVar12 = (*psVar7->xSync)((sqlite3_file *)psVar7,(int)psVar8);
    if (iVar12 == 0) {
      if (psVar17 != (sqlite3_io_methods *)0x0) {
        lVar13 = 0;
        psVar19 = psVar17;
        iVar18 = iVar16;
        do {
          if ((long)psVar4 < lVar13 + iVar18) {
            iVar18 = (int)psVar4 - (int)lVar13;
          }
          iVar12 = (*pJfd->pMethods->xWrite)(pJfd,&psVar19->xClose,iVar18,lVar13);
          if (iVar12 != 0) goto LAB_00135440;
          lVar13 = lVar13 + iVar18;
          psVar19 = *(sqlite3_io_methods **)psVar19;
        } while (psVar19 != (sqlite3_io_methods *)0x0);
        do {
          psVar14 = *(sqlite3_io_methods **)psVar17;
          sqlite3_free(psVar17);
          psVar17 = psVar14;
        } while (psVar14 != (sqlite3_io_methods *)0x0);
      }
      iVar12 = (*pJfd->pMethods->xWrite)(pJfd,zBuf,iAmt,iOfst);
      return iVar12;
    }
LAB_00135440:
    if (pJfd->pMethods != (sqlite3_io_methods *)0x0) {
      (*pJfd->pMethods->xClose)(pJfd);
    }
    pJfd->pMethods = psVar14;
    *(int *)&pJfd[1].pMethods = iVar16;
    *(undefined4 *)((long)&pJfd[2].pMethods + 4) = uVar2;
    *puVar1 = uVar3;
    pJfd[3].pMethods = psVar17;
    pJfd[4].pMethods = psVar4;
    pJfd[7].pMethods = psVar5;
    pJfd[5].pMethods = psVar10;
    pJfd[6].pMethods = psVar11;
    pJfd[8].pMethods = psVar6;
    pJfd[9].pMethods = psVar7;
    pJfd[10].pMethods = psVar8;
  }
  return iVar12;
}

Assistant:

static int memjrnlWrite(
  sqlite3_file *pJfd,    /* The journal file into which to write */
  const void *zBuf,      /* Take data to be written from here */
  int iAmt,              /* Number of bytes to write */
  sqlite_int64 iOfst     /* Begin writing at this offset into the file */
){
  MemJournal *p = (MemJournal *)pJfd;
  int nWrite = iAmt;
  u8 *zWrite = (u8 *)zBuf;

  /* If the file should be created now, create it and write the new data
  ** into the file on disk. */
  if( p->nSpill>0 && (iAmt+iOfst)>p->nSpill ){
    int rc = memjrnlCreateFile(p);
    if( rc==SQLITE_OK ){
      rc = sqlite3OsWrite(pJfd, zBuf, iAmt, iOfst);
    }
    return rc;
  }

  /* If the contents of this write should be stored in memory */
  else{
    /* An in-memory journal file should only ever be appended to. Random
    ** access writes are not required. The only exception to this is when
    ** the in-memory journal is being used by a connection using the
    ** atomic-write optimization. In this case the first 28 bytes of the
    ** journal file may be written as part of committing the transaction. */ 
    assert( iOfst==p->endpoint.iOffset || iOfst==0 );
#if defined(SQLITE_ENABLE_ATOMIC_WRITE) \
 || defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    if( iOfst==0 && p->pFirst ){
      assert( p->nChunkSize>iAmt );
      memcpy((u8*)p->pFirst->zChunk, zBuf, iAmt);
    }else
#else
    assert( iOfst>0 || p->pFirst==0 );
#endif
    {
      while( nWrite>0 ){
        FileChunk *pChunk = p->endpoint.pChunk;
        int iChunkOffset = (int)(p->endpoint.iOffset%p->nChunkSize);
        int iSpace = MIN(nWrite, p->nChunkSize - iChunkOffset);

        if( iChunkOffset==0 ){
          /* New chunk is required to extend the file. */
          FileChunk *pNew = sqlite3_malloc(fileChunkSize(p->nChunkSize));
          if( !pNew ){
            return SQLITE_IOERR_NOMEM_BKPT;
          }
          pNew->pNext = 0;
          if( pChunk ){
            assert( p->pFirst );
            pChunk->pNext = pNew;
          }else{
            assert( !p->pFirst );
            p->pFirst = pNew;
          }
          p->endpoint.pChunk = pNew;
        }

        memcpy((u8*)p->endpoint.pChunk->zChunk + iChunkOffset, zWrite, iSpace);
        zWrite += iSpace;
        nWrite -= iSpace;
        p->endpoint.iOffset += iSpace;
      }
      p->nSize = iAmt + iOfst;
    }
  }

  return SQLITE_OK;
}